

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O0

string * zstr::Exception::error_to_message_abi_cxx11_(z_stream *zstrm_p,int ret)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int in_EDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostringstream oss;
  string *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_380 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  ostringstream local_1a0 [394];
  allocator local_16;
  undefined1 local_15;
  int local_14;
  long local_10;
  
  local_15 = 0;
  __lhs = in_RDI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"zlib: ",&local_16);
  std::allocator<char>::~allocator((allocator<char> *)&local_16);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(local_14 + 6)
  ;
  switch(__rhs) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    std::__cxx11::string::operator+=((string *)in_RDI,"Z_VERSION_ERROR: ");
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    std::__cxx11::string::operator+=((string *)in_RDI,"Z_BUF_ERROR: ");
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    std::__cxx11::string::operator+=((string *)in_RDI,"Z_MEM_ERROR: ");
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    std::__cxx11::string::operator+=((string *)in_RDI,"Z_DATA_ERROR: ");
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    std::__cxx11::string::operator+=((string *)in_RDI,"Z_STREAM_ERROR: ");
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::ostream::operator<<(local_1a0,local_14);
    std::__cxx11::ostringstream::str();
    std::operator+((char *)__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::string::operator+=((string *)in_RDI,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  if (*(long *)(local_10 + 0x30) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,*(char **)(local_10 + 0x30));
  }
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc98);
  std::operator+((char *)__lhs,__rhs);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc98);
  std::operator+(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc98);
  std::operator+(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc98);
  std::operator+(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::string::operator+=((string *)in_RDI,local_220);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string(local_320);
  return __lhs;
}

Assistant:

static std::string error_to_message(z_stream* zstrm_p, int ret) {
    std::string msg = "zlib: ";
    switch (ret) {
      case Z_STREAM_ERROR:
        msg += "Z_STREAM_ERROR: ";
        break;
      case Z_DATA_ERROR:
        msg += "Z_DATA_ERROR: ";
        break;
      case Z_MEM_ERROR:
        msg += "Z_MEM_ERROR: ";
        break;
      case Z_VERSION_ERROR:
        msg += "Z_VERSION_ERROR: ";
        break;
      case Z_BUF_ERROR:
        msg += "Z_BUF_ERROR: ";
        break;
      default:
        std::ostringstream oss;
        oss << ret;
        msg += "[" + oss.str() + "]: ";
        break;
    }
    if (zstrm_p->msg) {
      msg += zstrm_p->msg;
    }
    msg +=
        " ("
        "next_in: " +
        std::to_string(uintptr_t(zstrm_p->next_in)) +
        ", avail_in: " + std::to_string(uintptr_t(zstrm_p->avail_in)) +
        ", next_out: " + std::to_string(uintptr_t(zstrm_p->next_out)) +
        ", avail_out: " + std::to_string(uintptr_t(zstrm_p->avail_out)) + ")";
    return msg;
  }